

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiBufferTests.cpp
# Opt level: O3

TestCaseGroup * vkt::api::createBufferTests(TestContext *testCtx)

{
  TestNode *this;
  ostream *poVar1;
  TestNode *node;
  long lVar2;
  ostringstream testDescription;
  ostringstream testName;
  long *local_378;
  long local_368 [2];
  long local_358;
  TestContext *local_350;
  long local_348;
  long *local_340;
  long local_330 [2];
  ostringstream local_320 [112];
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  this = (TestNode *)operator_new(0x70);
  local_350 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)this,testCtx,"buffer","Buffer Tests");
  local_358 = 0;
  do {
    local_348 = (ulong)(uint)(&DAT_00ad0a30)[local_358] << 0x20;
    lVar2 = 1;
    do {
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::__cxx11::ostringstream::ostringstream(local_320);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"create_buffer_",0xe);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"_",1);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_320,"vkCreateBuffer test ",0x14);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_320);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      node = (TestNode *)operator_new(0x80);
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringbuf::str();
      tcu::TestCase::TestCase((TestCase *)node,local_350,(char *)local_378,(char *)local_340);
      node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d24d10;
      node[1]._vptr_TestNode = (_func_int **)(local_348 + lVar2);
      *(undefined4 *)&node[1].m_testCtx = 0;
      tcu::TestNode::addChild(this,node);
      if (local_340 != local_330) {
        operator_delete(local_340,local_330[0] + 1);
      }
      if (local_378 != local_368) {
        operator_delete(local_378,local_368[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream(local_320);
      std::ios_base::~ios_base(local_2b0);
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x100);
    local_358 = local_358 + 1;
  } while (local_358 != 5);
  return (TestCaseGroup *)this;
}

Assistant:

tcu::TestCaseGroup* createBufferTests (tcu::TestContext& testCtx)
{
	const VkBufferUsageFlags bufferUsageModes[] =
	{
		VK_BUFFER_USAGE_TRANSFER_SRC_BIT,
		VK_BUFFER_USAGE_TRANSFER_DST_BIT,
		VK_BUFFER_USAGE_UNIFORM_TEXEL_BUFFER_BIT,
		VK_BUFFER_USAGE_STORAGE_TEXEL_BUFFER_BIT,
		VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT,
		VK_BUFFER_USAGE_STORAGE_BUFFER_BIT,
		VK_BUFFER_USAGE_INDEX_BUFFER_BIT,
		VK_BUFFER_USAGE_VERTEX_BUFFER_BIT,
		VK_BUFFER_USAGE_INDIRECT_BUFFER_BIT
	};

	// \note SPARSE_RESIDENCY and SPARSE_ALIASED have to be used together with the SPARSE_BINDING flag.
	const VkBufferCreateFlags bufferCreateFlags[] =
	{
		0,
		VK_BUFFER_CREATE_SPARSE_BINDING_BIT,
		VK_BUFFER_CREATE_SPARSE_BINDING_BIT	|	VK_BUFFER_CREATE_SPARSE_RESIDENCY_BIT,
		VK_BUFFER_CREATE_SPARSE_BINDING_BIT	|												VK_BUFFER_CREATE_SPARSE_ALIASED_BIT,
		VK_BUFFER_CREATE_SPARSE_BINDING_BIT	|	VK_BUFFER_CREATE_SPARSE_RESIDENCY_BIT	|	VK_BUFFER_CREATE_SPARSE_ALIASED_BIT,
	};

	de::MovePtr<tcu::TestCaseGroup>	buffersTests	(new tcu::TestCaseGroup(testCtx, "buffer", "Buffer Tests"));

	const deUint32 maximumValueOfBufferUsageFlags	= (1u << (DE_LENGTH_OF_ARRAY(bufferUsageModes) - 1)) - 1u;

	for (deUint32 bufferCreateFlagsNdx = 0u; bufferCreateFlagsNdx < DE_LENGTH_OF_ARRAY(bufferCreateFlags); bufferCreateFlagsNdx++)
	for (deUint32 combinedBufferUsageFlags = 1u; combinedBufferUsageFlags <= maximumValueOfBufferUsageFlags; combinedBufferUsageFlags++)
	{
		const BufferCaseParameters	testParams =
		{
			combinedBufferUsageFlags,
			bufferCreateFlags[bufferCreateFlagsNdx],
			VK_SHARING_MODE_EXCLUSIVE
		};
		std::ostringstream	testName;
		std::ostringstream	testDescription;
		testName << "create_buffer_" << combinedBufferUsageFlags << "_" << testParams.flags;
		testDescription << "vkCreateBuffer test " << combinedBufferUsageFlags << " " << testParams.flags;
		buffersTests->addChild(new BuffersTestCase(testCtx, testName.str(), testDescription.str(), testParams));
	}

	return buffersTests.release();
}